

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O3

void __thiscall
iu_UnitStringTest_x_iutest_x_InvalidVsnprintf_Test::Body
          (iu_UnitStringTest_x_iutest_x_InvalidVsnprintf_Test *this)

{
  int *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_1f1;
  AssertionResult local_1f0;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  local_198._0_4_ = 0xffffffff;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
       test_print((char *)0x0,1,"test");
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1f0,(internal *)"-1","test_print(__null, 1, \"test\")",local_198,
             (int *)&local_1c8,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x95;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_1c8.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != &local_1f0.m_message.field_2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, InvalidVsnprintf)
{
    IUTEST_EXPECT_EQ(-1, test_print(NULL, 1, "test"));
}